

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O0

SequenceD<64> * __thiscall
DES::operator()(SequenceD<64> *__return_storage_ptr__,DES *this,SequenceD<64> *seq)

{
  Sequence *pSVar1;
  Sequence *t_right;
  Permutation<64,_64> local_411;
  undefined1 local_410 [8];
  SequenceD<64> swapSeq;
  Sequence local_2b0;
  undefined1 local_258 [8];
  Sequence xorSeq;
  Sequence tmpSeq;
  int i;
  Permutation<64,_64> local_191;
  undefined1 local_190 [8];
  SequenceD<64> tmp;
  F f;
  SequenceD<64> *seq_local;
  DES *this_local;
  
  F::F((F *)((long)&tmp.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish + 0x18),&this->m_key);
  Permutation<64,_64>::operator()((SequenceD<64> *)local_190,&local_191,seq,&INITIAL_PERMUTATION);
  for (tmpSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node._0_4_ = 0;
      (int)tmpSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_node < 0x10;
      tmpSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._0_4_ =
           (int)tmpSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node + 1) {
    pSVar1 = SequenceD<64>::right((SequenceD<64> *)local_190);
    F::operator()((Sequence *)
                  &xorSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node,
                  (F *)((long)&tmp.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                               _M_impl.super__Deque_impl_data._M_finish + 0x18),pSVar1);
    pSVar1 = SequenceD<64>::left((SequenceD<64> *)local_190);
    Sequence::Sequence(&local_2b0,
                       (Sequence *)
                       &xorSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node);
    Sequence::operator*((Sequence *)local_258,pSVar1,&local_2b0);
    Sequence::~Sequence(&local_2b0);
    pSVar1 = SequenceD<64>::right((SequenceD<64> *)local_190);
    SequenceD<64>::SequenceD
              ((SequenceD<64> *)
               ((long)&swapSeq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18),pSVar1,(Sequence *)local_258);
    SequenceD<64>::operator=
              ((SequenceD<64> *)local_190,
               (SequenceD<64> *)
               ((long)&swapSeq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18));
    SequenceD<64>::~SequenceD
              ((SequenceD<64> *)
               ((long)&swapSeq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18));
    Sequence::~Sequence((Sequence *)local_258);
    Sequence::~Sequence((Sequence *)
                        &xorSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
  }
  pSVar1 = SequenceD<64>::right((SequenceD<64> *)local_190);
  t_right = SequenceD<64>::left((SequenceD<64> *)local_190);
  SequenceD<64>::SequenceD((SequenceD<64> *)local_410,pSVar1,t_right);
  Permutation<64,_64>::operator()
            (__return_storage_ptr__,&local_411,(SequenceD<64> *)local_410,
             &INITIAL_PERMUTATION_REVERSE);
  SequenceD<64>::~SequenceD((SequenceD<64> *)local_410);
  SequenceD<64>::~SequenceD((SequenceD<64> *)local_190);
  F::~F((F *)((long)&tmp.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish + 0x18));
  return __return_storage_ptr__;
}

Assistant:

SequenceD<64> DES::operator()(SequenceD<64> seq) {
    F f(m_key);
    // Initial permutation
    auto tmp = Permutation<64, 64>{}(seq, INITIAL_PERMUTATION);

    // For each round, compute the intermediate sequence
    for (auto i = 0; i < 16; ++i) {
        auto tmpSeq = f(tmp.right());
        auto xorSeq = tmp.left() * tmpSeq;
        tmp = SequenceD<64>{tmp.right(), xorSeq};
    }

    // Final byte swao and permutation
    auto swapSeq = SequenceD<64>{tmp.right(), tmp.left()};
    return Permutation<64, 64>{}(swapSeq, INITIAL_PERMUTATION_REVERSE);
}